

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O0

ON_SubDMeshFragment * __thiscall
ON_SubDHeap::AllocateMeshFragment
          (ON_SubDHeap *this,uint subd_display_density,ON_SubDMeshFragment *src_fragment)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  bool bVar6;
  uint local_e0;
  uint local_dc;
  size_t local_d8;
  size_t local_d0;
  ON_FixedSizePool *local_c8;
  ON_FixedSizePool *local_c0;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  ON_FixedSizePoolElement *ele;
  size_t sizeof_fragment_1;
  undefined1 local_80 [8];
  ON_SleepLockGuard guard;
  char *p1;
  char *p;
  ON_SubDMeshFragment *fragment;
  size_t min_fsp_2nd_block_element_count;
  size_t fragment_count_estimate;
  size_t sizeof_fragment;
  ON_FixedSizePool *fsp;
  bool bUsePartFragmentFSP;
  bool bUseFullFragmentFSP;
  unsigned_short vertex_capacity;
  unsigned_short side_seg_count;
  uint count;
  uint density;
  ON_SubDMeshFragment *src_fragment_local;
  uint subd_display_density_local;
  ON_SubDHeap *this_local;
  
  if (6 < subd_display_density) {
    ON_SubDIncrementErrorCount();
    return (ON_SubDMeshFragment *)0x0;
  }
  if (src_fragment->m_face_fragment_count < 2) {
    local_b4 = subd_display_density;
    if (src_fragment->m_face_fragment_count != 1) {
      local_b4 = 0xffffffff;
    }
    local_b0 = local_b4;
  }
  else {
    if (subd_display_density == 0) {
      local_ac = 0xffffffff;
    }
    else {
      local_ac = subd_display_density - 1;
    }
    local_b0 = local_ac;
  }
  if (local_b0 == 0xffffffff) {
    ON_SubDIncrementErrorCount();
    return (ON_SubDMeshFragment *)0x0;
  }
  if (6 < local_b0) {
    ON_SubDIncrementErrorCount();
    return (ON_SubDMeshFragment *)0x0;
  }
  uVar3 = ON_SubDMeshFragment::SideSegmentCountFromDisplayDensity(local_b0);
  uVar1 = ((short)uVar3 + 1) * ((short)uVar3 + 1);
  uVar3 = ON_SubDMeshFragment::VertexCount(src_fragment);
  if ((uVar3 != 0) && (uVar3 = ON_SubDMeshFragment::VertexCount(src_fragment), uVar3 < uVar1)) {
    ON_SubDIncrementErrorCount();
    return (ON_SubDMeshFragment *)0x0;
  }
  if ((this->m_full_fragment_display_density == 0) &&
     (bVar2 = Internal_InitializeFragmentCountEstimates(this,subd_display_density), !bVar2)) {
    ON_SubDIncrementErrorCount();
    return (ON_SubDMeshFragment *)0x0;
  }
  if ((this->m_full_fragment_display_density == 0) || (5 < this->m_full_fragment_display_density)) {
    ON_SubDIncrementErrorCount();
    return (ON_SubDMeshFragment *)0x0;
  }
  bVar2 = local_b0 != this->m_full_fragment_display_density;
  bVar6 = local_b0 + 1 == this->m_full_fragment_display_density;
  if (bVar2) {
    if (bVar6) {
      local_c8 = &this->m_fsp_part_fragments;
    }
    else {
      local_c8 = &this->m_fsp_oddball_fragments;
    }
    local_c0 = local_c8;
  }
  else {
    local_c0 = &this->m_fsp_full_fragments;
  }
  sVar5 = ON_FixedSizePool::SizeofElement(local_c0);
  if (sVar5 == 0) {
    if (bVar2) {
      if (bVar6) {
        local_d8 = g_sizeof_fragment[this->m_full_fragment_display_density - 1];
      }
      else {
        local_d8 = g_sizeof_fragment[6];
      }
      local_d0 = local_d8;
    }
    else {
      local_d0 = g_sizeof_fragment[this->m_full_fragment_display_density];
    }
    if (bVar2) {
      if (bVar6) {
        local_e0 = this->m_part_fragment_count_estimate;
      }
      else {
        local_e0 = 4;
      }
      local_dc = local_e0;
    }
    else {
      local_dc = this->m_full_fragment_count_estimate;
    }
    iVar4 = 1;
    if (!bVar2 || bVar6) {
      iVar4 = 0x20;
    }
    bVar2 = Internal_InitializeMeshFragmentPool(local_d0,(ulong)local_dc,(long)iVar4,local_c0);
    if (!bVar2) {
      ON_SubDIncrementErrorCount();
      return (ON_SubDMeshFragment *)0x0;
    }
  }
  guard.m_bIsManagingLock = false;
  guard._9_7_ = 0;
  ON_SleepLockGuard::ON_SleepLockGuard((ON_SleepLockGuard *)local_80,local_c0);
  if (this->m_unused_fragments[local_b0] == (ON_FixedSizePoolElement *)0x0) {
    p1 = (char *)ON_FixedSizePool::AllocateDirtyElement(local_c0);
    if ((ON_FixedSizePoolElement *)p1 == (ON_FixedSizePoolElement *)0x0) {
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubDHeap *)0x0;
      bVar2 = true;
      goto LAB_008f45ac;
    }
    sVar5 = ON_FixedSizePool::SizeofElement(local_c0);
    guard._8_8_ = (long)&((ON_FixedSizePoolElement *)p1)->m_next + sVar5;
    this->m_unused_fragments[local_b0] = (ON_FixedSizePoolElement *)p1;
    this->m_unused_fragments[local_b0]->m_next = (ON_FixedSizePoolElement *)0x0;
    sVar5 = g_sizeof_fragment[local_b0];
    while (p1 = (char *)((long)&((ON_FixedSizePoolElement *)p1)->m_next + sVar5),
          p1 + sVar5 <= (ulong)guard._8_8_) {
      *(ON_FixedSizePoolElement **)p1 = this->m_unused_fragments[local_b0];
      this->m_unused_fragments[local_b0] = (ON_FixedSizePoolElement *)p1;
    }
  }
  p = (char *)this->m_unused_fragments[local_b0];
  this->m_unused_fragments[local_b0] = this->m_unused_fragments[local_b0]->m_next;
  bVar2 = false;
LAB_008f45ac:
  ON_SleepLockGuard::~ON_SleepLockGuard((ON_SleepLockGuard *)local_80);
  if (!bVar2) {
    memcpy(p,&ON_SubDMeshFragment::Empty,0x248);
    p[0x20] = '\0';
    p[0x21] = '\0';
    p[0x22] = '\0';
    p[0x23] = '\0';
    p[0x24] = '\0';
    p[0x25] = '\0';
    p[0x26] = '\0';
    p[0x27] = '\0';
    p[0x18] = '\0';
    p[0x19] = '\0';
    p[0x1a] = '\0';
    p[0x1b] = '\0';
    p[0x1c] = '\0';
    p[0x1d] = '\0';
    p[0x1e] = '\0';
    p[0x1f] = '\0';
    ON_SubDMeshFragment::Internal_LayoutArrays
              ((ON_SubDMeshFragment *)p,(ulong)uVar1,(double *)(p + 0x248));
    uVar3 = ON_SubDMeshFragment::VertexCount(src_fragment);
    if (uVar3 != 0) {
      ON_SubDMeshFragment::CopyFrom((ON_SubDMeshFragment *)p,src_fragment,local_b0);
    }
    this_local = (ON_SubDHeap *)p;
  }
  return (ON_SubDMeshFragment *)this_local;
}

Assistant:

ON_SubDMeshFragment* ON_SubDHeap::AllocateMeshFragment(
  unsigned subd_display_density,
  const ON_SubDMeshFragment& src_fragment
)
{
  if (subd_display_density > ON_SubDDisplayParameters::MaximumDensity)
    return ON_SUBD_RETURN_ERROR(nullptr);

  // When 4 == ON_SubDDisplayParameters::DefaultDensity (setting used in February 2019)
  // quads get a single fragment with a 16x16 face grid
  // N-gons with N != 4 get N 8x8 grids.

  // density = density of src_fragment
  const unsigned int density = (src_fragment.m_face_fragment_count > 1)
    ? ((subd_display_density > 0) ? (subd_display_density -1) : ON_UNSET_UINT_INDEX)
    : ((1==src_fragment.m_face_fragment_count) ? subd_display_density : ON_UNSET_UINT_INDEX)
    ;
  if (ON_UNSET_UINT_INDEX == density)
    return ON_SUBD_RETURN_ERROR(nullptr);
  const unsigned count = (unsigned)(sizeof(m_unused_fragments) / sizeof(m_unused_fragments[0]));
  if (density >= count)
    return ON_SUBD_RETURN_ERROR(nullptr);

  const unsigned short side_seg_count = (unsigned short)ON_SubDMeshFragment::SideSegmentCountFromDisplayDensity(density);
  const unsigned short vertex_capacity = (side_seg_count + 1)*(side_seg_count + 1);
  if ( src_fragment.VertexCount() > 0 && src_fragment.VertexCount() < ((unsigned)vertex_capacity) )
    return ON_SUBD_RETURN_ERROR(nullptr);

  if (0 == m_full_fragment_display_density)
  {
    // Lazy initialization of m_full_fragment_display_density is done because
    // we don't know the display density when SubDs are being constructed.
    if (false == Internal_InitializeFragmentCountEstimates(subd_display_density))
      return ON_SUBD_RETURN_ERROR(nullptr);
  }
  if (m_full_fragment_display_density <= 0 || m_full_fragment_display_density >= ON_SubDDisplayParameters::MaximumDensity)
    return ON_SUBD_RETURN_ERROR(nullptr);

  // In all common situations, bUseFullFragmentFSP or bUsePartFragmentFSP is true.
  const bool bUseFullFragmentFSP = (density == this->m_full_fragment_display_density);
  const bool bUsePartFragmentFSP = (density+1 == this->m_full_fragment_display_density);

  ON_FixedSizePool& fsp 
    = bUseFullFragmentFSP
    ? m_fsp_full_fragments
    : bUsePartFragmentFSP ? m_fsp_part_fragments : m_fsp_oddball_fragments;

  if (0 == fsp.SizeofElement())
  {
    // Lazy initialization of the fragment fixed size pools
    // is done so that we don't reserve pool memory that never gets used.

    const size_t sizeof_fragment
      = bUseFullFragmentFSP
      ? ON_SubDHeap::g_sizeof_fragment[m_full_fragment_display_density]
      : (bUsePartFragmentFSP ? ON_SubDHeap::g_sizeof_fragment[m_full_fragment_display_density - 1U] : ON_SubDHeap::g_sizeof_fragment[ON_SubDDisplayParameters::MaximumDensity])
      ;

    const size_t fragment_count_estimate
      = bUseFullFragmentFSP
      ? m_full_fragment_count_estimate
      : (bUsePartFragmentFSP ? m_part_fragment_count_estimate : ((unsigned)4U))
      ;

    const size_t min_fsp_2nd_block_element_count = (bUseFullFragmentFSP || bUsePartFragmentFSP) ? 32 : 1;

    if (false == this->Internal_InitializeMeshFragmentPool(
      sizeof_fragment,
      fragment_count_estimate,
      min_fsp_2nd_block_element_count,
      fsp
    ))
    {
      return ON_SUBD_RETURN_ERROR(nullptr);
    }
  }

  ON_SubDMeshFragment* fragment;
  {
    char* p = nullptr;
    char* p1 = nullptr;
    ON_SleepLockGuard guard(fsp);
    if (nullptr == m_unused_fragments[density])
    {
      p = (char*)fsp.AllocateDirtyElement();
      if (nullptr == p)
        return ON_SUBD_RETURN_ERROR(nullptr);
      p1 = p + fsp.SizeofElement();
      m_unused_fragments[density] = (ON_FixedSizePoolElement*)p;
      m_unused_fragments[density]->m_next = nullptr;
      const size_t sizeof_fragment = ON_SubDHeap::g_sizeof_fragment[density];
      for (p += sizeof_fragment; p + sizeof_fragment <= p1; p += sizeof_fragment)
      {
        // This loop is rarely executed.
        // It is used when an unusual small fragment is allocated from a pool
        // providing large fragments (fsp.SizeofElement() > sizeof_fragment).
        // If fsp.SizeofElement() is not an even multiple of sizeof_fragment,
        // then some memory is wasted. Because this situation is uncommon,
        // the waste doesn't matter in the big scheme of things.
        ON_FixedSizePoolElement* ele = (ON_FixedSizePoolElement*)p;
        ele->m_next = m_unused_fragments[density];
        m_unused_fragments[density] = ele;          
      }
    }
    fragment = (ON_SubDMeshFragment*)m_unused_fragments[density];
    m_unused_fragments[density] = m_unused_fragments[density]->m_next;
  }

  // NO // *fragment = src_fragment;
  *fragment = ON_SubDMeshFragment::Empty;
  fragment->m_prev_fragment = nullptr;
  fragment->m_next_fragment = nullptr;

  // NOTE WELL:
  //   fragment and fragment array memory are from a single fixed size pool allocation.
  fragment->Internal_LayoutArrays(vertex_capacity, (double*)(fragment + 1) );

  if (src_fragment.VertexCount() > 0)
    fragment->CopyFrom(src_fragment,density);

  return fragment;
}